

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_picker.cpp
# Opt level: O0

void QtMWidgets::Picker::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined4 *puVar1;
  code *pcVar2;
  QColor *c;
  int iVar3;
  QColor QVar4;
  void *_v_1;
  Picker *_t_2;
  undefined4 local_90;
  undefined2 uStack_8c;
  QVariant local_78;
  QString local_58;
  QVariant *local_40;
  void *_v;
  Picker *_t_1;
  int *result;
  Picker *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  _t = (Picker *)_a;
  _a_local._0_4_ = _id;
  _a_local._4_4_ = _c;
  __id_local = _o;
  if (_c == InvokeMetaMethod) {
    result = (int *)_o;
    switch(_id) {
    case 0:
      activated((Picker *)_o,*_a[1]);
      break;
    case 1:
      activated((Picker *)_o,(QString *)_a[1]);
      break;
    case 2:
      currentIndexChanged((Picker *)_o,*_a[1]);
      break;
    case 3:
      currentIndexChanged((Picker *)_o,(QString *)_a[1]);
      break;
    case 4:
      currentTextChanged((Picker *)_o,(QString *)_a[1]);
      break;
    case 5:
      clear((Picker *)_o);
      break;
    case 6:
      setCurrentIndex((Picker *)_o,*_a[1]);
      break;
    case 7:
      setCurrentText((Picker *)_o,(QString *)_a[1]);
      break;
    case 8:
      scrollTo((Picker *)_o,*_a[1]);
      break;
    case 9:
      _q_emitCurrentIndexChanged((Picker *)_o,(QModelIndex *)_a[1]);
      break;
    case 10:
      _q_dataChanged((Picker *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
      break;
    case 0xb:
      _q_updateIndexBeforeChange((Picker *)_o);
      break;
    case 0xc:
      _q_rowsInserted((Picker *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
      break;
    case 0xd:
      _q_rowsRemoved((Picker *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
      break;
    case 0xe:
      _q_modelDestroyed((Picker *)_o);
      break;
    case 0xf:
      _q_modelReset((Picker *)_o);
      break;
    case 0x10:
      _q_scroll((Picker *)_o,*_a[1],*_a[2]);
    }
  }
  else if (_c == IndexOfMethod) {
    puVar1 = (undefined4 *)*_a;
    pcVar2 = *_a[1];
    if (pcVar2 == activated && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *puVar1 = 0;
    }
    else {
      pcVar2 = *_a[1];
      if (pcVar2 == activated && (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *puVar1 = 1;
      }
      else {
        pcVar2 = *_a[1];
        if (pcVar2 == currentIndexChanged &&
            (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
          *puVar1 = 2;
        }
        else {
          pcVar2 = *_a[1];
          if (pcVar2 == currentIndexChanged &&
              (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
            *puVar1 = 3;
          }
          else {
            pcVar2 = *_a[1];
            if (pcVar2 == currentTextChanged &&
                (pcVar2 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
              *puVar1 = 4;
            }
          }
        }
      }
    }
  }
  else if (_c == ReadProperty) {
    local_40 = (QVariant *)*_a;
    _v = _o;
    switch(_id) {
    case 0:
      iVar3 = count((Picker *)_o);
      *(int *)&(local_40->d).data = iVar3;
      break;
    case 1:
      iVar3 = currentIndex((Picker *)_o);
      *(int *)&(local_40->d).data = iVar3;
      break;
    case 2:
      currentText(&local_58,(Picker *)_o);
      QString::operator=((QString *)local_40,&local_58);
      QString::~QString(&local_58);
      break;
    case 3:
      currentData(&local_78,(Picker *)_o,0x100);
      QVariant::operator=(local_40,&local_78);
      QVariant::~QVariant(&local_78);
      break;
    case 4:
      iVar3 = modelColumn((Picker *)_o);
      *(int *)&(local_40->d).data = iVar3;
      break;
    case 5:
      iVar3 = maxCount((Picker *)_o);
      *(int *)&(local_40->d).data = iVar3;
      break;
    case 6:
      QVar4 = highlightColor((Picker *)_o);
      _t_2 = QVar4._0_8_;
      local_90 = QVar4.ct._4_4_;
      uStack_8c = QVar4.ct._8_2_;
      (local_40->d).data.shared = (PrivateShared *)_t_2;
      *(undefined4 *)((long)&(local_40->d).data + 8) = local_90;
      *(undefined2 *)((long)&(local_40->d).data + 0xc) = uStack_8c;
    }
  }
  else if (_c == WriteProperty) {
    c = (QColor *)*_a;
    switch(_id) {
    case 1:
      setCurrentIndex((Picker *)_o,c->cspec);
      break;
    case 2:
      setCurrentText((Picker *)_o,(QString *)c);
      break;
    default:
      break;
    case 4:
      setModelColumn((Picker *)_o,c->cspec);
      break;
    case 5:
      setMaxCount((Picker *)_o,c->cspec);
      break;
    case 6:
      setHighlightColor((Picker *)_o,c);
    }
  }
  return;
}

Assistant:

void QtMWidgets::Picker::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->clear(); break;
        case 6: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setCurrentText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->scrollTo((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->_q_emitCurrentIndexChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 10: _t->_q_dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 11: _t->_q_updateIndexBeforeChange(); break;
        case 12: _t->_q_rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 13: _t->_q_rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->_q_modelDestroyed(); break;
        case 15: _t->_q_modelReset(); break;
        case 16: _t->_q_scroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Picker::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::activated)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::activated)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (Picker::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentIndexChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentIndexChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentTextChanged)) {
                *result = 4;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->count(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->currentIndex(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->currentText(); break;
        case 3: *reinterpret_cast< QVariant*>(_v) = _t->currentData(); break;
        case 4: *reinterpret_cast< int*>(_v) = _t->modelColumn(); break;
        case 5: *reinterpret_cast< int*>(_v) = _t->maxCount(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->highlightColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setCurrentIndex(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setCurrentText(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setModelColumn(*reinterpret_cast< int*>(_v)); break;
        case 5: _t->setMaxCount(*reinterpret_cast< int*>(_v)); break;
        case 6: _t->setHighlightColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}